

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::ScanLineInputFile::initialize(ScanLineInputFile *this,Header *header)

{
  int iVar1;
  int iVar2;
  Format FVar3;
  int iVar4;
  LineOrder *pLVar5;
  Box2i *pBVar6;
  size_t maxScanLineSize;
  LineBuffer *pLVar7;
  Compression *pCVar8;
  Compressor *compressor;
  char *pcVar9;
  InputExc *this_00;
  pointer ppLVar10;
  Data *pDVar11;
  ulong uVar12;
  
  Header::operator=(&this->_data->header,header);
  pLVar5 = Header::lineOrder(&this->_data->header);
  pDVar11 = this->_data;
  pDVar11->lineOrder = *pLVar5;
  pBVar6 = Header::dataWindow(&pDVar11->header);
  pDVar11 = this->_data;
  iVar4 = (pBVar6->min).y;
  iVar1 = (pBVar6->max).x;
  iVar2 = (pBVar6->max).y;
  pDVar11->minX = (pBVar6->min).x;
  pDVar11->maxX = iVar1;
  pDVar11->minY = iVar4;
  pDVar11->maxY = iVar2;
  maxScanLineSize = bytesPerLineTable(&pDVar11->header,&pDVar11->bytesPerLine);
  if (maxScanLineSize < 0x80000000) {
    uVar12 = 0;
    while( true ) {
      pDVar11 = this->_data;
      ppLVar10 = (pDVar11->lineBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar11->lineBuffers).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar10 >> 3) <= uVar12)
      break;
      pLVar7 = (LineBuffer *)operator_new(0x80);
      pCVar8 = Header::compression(&pDVar11->header);
      compressor = newCompressor(*pCVar8,maxScanLineSize,&this->_data->header);
      (pLVar7->buffer)._size = 0;
      (pLVar7->buffer)._data = (char *)0x0;
      *(undefined4 *)&pLVar7->dataPtr = 0;
      pLVar7->endOfLineBufferData = (char *)compressor;
      FVar3 = defaultFormat(compressor);
      pLVar7->minY = FVar3;
      pLVar7->maxY = -1;
      *(undefined1 *)&pLVar7->scanLineMin = 0;
      pLVar7->compressor = (Compressor *)&pLVar7->exception;
      pLVar7->partiallyFull = false;
      pLVar7->hasException = false;
      *(undefined6 *)&pLVar7->field_0x42 = 0;
      *(undefined1 *)&(pLVar7->exception)._M_dataplus._M_p = 0;
      IlmThread_2_5::Semaphore::Semaphore((Semaphore *)(pLVar7->exception).field_2._M_local_buf,1);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar12] = pLVar7;
      uVar12 = uVar12 + 1;
    }
    iVar4 = numLinesInBuffer((Compressor *)(*ppLVar10)->endOfLineBufferData);
    pDVar11 = this->_data;
    pDVar11->linesInBuffer = iVar4;
    pDVar11->lineBufferSize = maxScanLineSize * (long)iVar4;
    iVar4 = (*this->_streamData->is->_vptr_IStream[2])();
    pDVar11 = this->_data;
    if ((char)iVar4 == '\0') {
      ppLVar10 = (pDVar11->lineBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      for (uVar12 = 0;
          uVar12 < (ulong)((long)(pDVar11->lineBuffers).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar10 >> 3);
          uVar12 = uVar12 + 1) {
        pcVar9 = (char *)EXRAllocAligned(pDVar11->lineBufferSize,0x10);
        pDVar11 = this->_data;
        ppLVar10 = (pDVar11->lineBuffers).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        (ppLVar10[uVar12]->buffer)._data = pcVar9;
      }
    }
    pDVar11->nextLineBufferMinY = pDVar11->minY + -1;
    offsetInLineBufferTable
              (&pDVar11->bytesPerLine,pDVar11->linesInBuffer,&pDVar11->offsetInLineBuffer);
    iVar4 = this->_data->linesInBuffer;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->_data->lineOffsets,
               (long)((((pBVar6->max).y - (pBVar6->min).y) + iVar4) / iVar4));
    return;
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this_00,"maximum bytes per scanline exceeds maximum permissible size")
  ;
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void ScanLineInputFile::initialize(const Header& header)
{
        _data->header = header;

        _data->lineOrder = _data->header.lineOrder();

        const Box2i &dataWindow = _data->header.dataWindow();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        size_t maxBytesPerLine = bytesPerLineTable (_data->header,
                                                    _data->bytesPerLine);
        
        if(maxBytesPerLine > INT_MAX)
        {
            throw IEX_NAMESPACE::InputExc("maximum bytes per scanline exceeds maximum permissible size");
        }


        for (size_t i = 0; i < _data->lineBuffers.size(); i++)
        {
            _data->lineBuffers[i] = new LineBuffer (newCompressor
                                                (_data->header.compression(),
                                                 maxBytesPerLine,
                                                 _data->header));
        }

        _data->linesInBuffer =
            numLinesInBuffer (_data->lineBuffers[0]->compressor);

        _data->lineBufferSize = maxBytesPerLine * _data->linesInBuffer;

        if (!_streamData->is->isMemoryMapped())
        {
            for (size_t i = 0; i < _data->lineBuffers.size(); i++)
            {
                _data->lineBuffers[i]->buffer = (char *) EXRAllocAligned(_data->lineBufferSize*sizeof(char),16);
            }
        }
        _data->nextLineBufferMinY = _data->minY - 1;

        offsetInLineBufferTable (_data->bytesPerLine,
                                 _data->linesInBuffer,
                                 _data->offsetInLineBuffer);

        int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
                              _data->linesInBuffer) / _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);
}